

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_ManyUnknownModifiers::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *__s2;
  string local_238 [8];
  string out;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateDictionary local_1b8 [8];
  TemplateDictionary dict;
  TemplateString local_148;
  Template *local_128;
  Template *tpl2;
  string local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  int local_b8;
  allocator local_b1;
  int i;
  string expected_out;
  allocator local_89;
  string local_88 [8];
  string tpl_str2;
  TemplateString local_68;
  Template *local_48;
  Template *tpl1;
  allocator local_29;
  string local_28 [8];
  string tpl_str1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"{{from_name:x-test=4}} sent you a message",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ctemplate::TemplateString::TemplateString(&local_68,(string *)local_28);
  local_48 = (Template *)ctemplate::Template::StringToTemplate(&local_68,DO_NOT_STRIP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"{{from_name:x-test=4}} sent you a message:",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"me sent you a message:",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  for (local_b8 = 0; local_b8 < 0x457; local_b8 = local_b8 + 1) {
    uVar4 = (ulong)local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,uVar4,'t',(allocator *)((long)&tpl2 + 7));
    std::operator+((char *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "{{from_name:x-");
    std::operator+(local_d8,(char *)local_f8);
    std::__cxx11::string::append(local_88);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tpl2 + 7));
    std::__cxx11::string::append((char *)&i);
  }
  ctemplate::TemplateString::TemplateString(&local_148,(string *)local_88);
  local_128 = (Template *)ctemplate::Template::StringToTemplate(&local_148,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_1d8,"test");
  ctemplate::TemplateDictionary::TemplateDictionary(local_1b8,&local_1d8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_1f8,"from_name");
  ctemplate::TemplateString::TemplateString(&local_218,"me");
  TVar1.length_ = local_1f8.length_;
  TVar1.ptr_ = local_1f8.ptr_;
  TVar1.is_immutable_ = local_1f8.is_immutable_;
  TVar1._17_7_ = local_1f8._17_7_;
  TVar1.id_ = local_1f8.id_;
  TVar2.length_ = local_218.length_;
  TVar2.ptr_ = local_218.ptr_;
  TVar2.is_immutable_ = local_218.is_immutable_;
  TVar2._17_7_ = local_218._17_7_;
  TVar2.id_ = local_218.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  std::__cxx11::string::string(local_238);
  std::__cxx11::string::clear();
  ctemplate::Template::Expand(local_48,(string *)local_238,(TemplateDictionaryInterface *)local_1b8)
  ;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar3 = strcmp("me sent you a message",pcVar5);
  if (iVar3 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(\"me sent you a message\", out.c_str()) == 0");
    exit(1);
  }
  if (local_48 != (Template *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  std::__cxx11::string::clear();
  ctemplate::Template::Expand
            (local_128,(string *)local_238,(TemplateDictionaryInterface *)local_1b8);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar3 = strcmp(pcVar5,__s2);
  if (iVar3 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(expected_out.c_str(), out.c_str()) == 0");
    exit(1);
  }
  if (local_128 != (Template *)0x0) {
    (**(code **)(*(long *)local_128 + 8))();
  }
  std::__cxx11::string::~string(local_238);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_1b8);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(TemplateModifiers, ManyUnknownModifiers) {
  string tpl_str1 = "{{from_name:x-test=4}} sent you a message";
  const GOOGLE_NAMESPACE::Template* tpl1 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str1, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  string tpl_str2 = "{{from_name:x-test=4}} sent you a message:";
  string expected_out = "me sent you a message:";
  // All those new unknown varnames should cause g_unknown_modifiers
  // to resize.  1111 is an arbitrary large number.
  for (int i = 0; i < 1111; i++) {
    tpl_str2.append("{{from_name:x-" + string(i, 't') + "=4}}");
    expected_out.append("me");
  }
  const GOOGLE_NAMESPACE::Template* tpl2 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str2, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  // Even after the resizing, the references to the unknown
  // modifiers in tpl1 and tpl2 should still be valid.
  GOOGLE_NAMESPACE::TemplateDictionary dict("test");
  dict.SetValue("from_name", "me");
  string out;

  out.clear();
  tpl1->Expand(&out, &dict);
  EXPECT_STREQ("me sent you a message", out.c_str());
  delete tpl1;

  out.clear();
  tpl2->Expand(&out, &dict);
  EXPECT_STREQ(expected_out.c_str(), out.c_str());
  delete tpl2;
}